

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O1

void __thiscall cmMakefile::RemoveDefinition(cmMakefile *this,string *name)

{
  cmake *pcVar1;
  bool bVar2;
  cmVariableWatch *this_00;
  
  bVar2 = cmStateSnapshot::IsInitialized(&this->StateSnapshot,name);
  if (bVar2) {
    LogUnused(this,"unsetting",name);
  }
  cmStateSnapshot::RemoveDefinition(&this->StateSnapshot,name);
  pcVar1 = this->GlobalGenerator->CMakeInstance;
  if (pcVar1 == (cmake *)0x0) {
    this_00 = (cmVariableWatch *)0x0;
  }
  else {
    this_00 = pcVar1->VariableWatch;
  }
  if (this_00 != (cmVariableWatch *)0x0) {
    cmVariableWatch::VariableAccessed(this_00,name,4,(char *)0x0,this);
    return;
  }
  return;
}

Assistant:

void cmMakefile::RemoveDefinition(const std::string& name)
{
  if (this->VariableInitialized(name)) {
    this->LogUnused("unsetting", name);
  }
  this->StateSnapshot.RemoveDefinition(name);
#ifdef CMAKE_BUILD_WITH_CMAKE
  cmVariableWatch* vv = this->GetVariableWatch();
  if (vv) {
    vv->VariableAccessed(name, cmVariableWatch::VARIABLE_REMOVED_ACCESS,
                         nullptr, this);
  }
#endif
}